

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_ConvertSignatureFromDerHexEmpty_Test::TestBody
          (CryptoUtil_ConvertSignatureFromDerHexEmpty_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  ByteData byte_data;
  undefined1 local_28 [8];
  ByteData hex_sig;
  CryptoUtil_ConvertSignatureFromDerHexEmpty_Test *this_local;
  
  hex_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::ByteData::ByteData((ByteData *)local_28);
  cfd::core::CryptoUtil::ConvertSignatureFromDer
            ((ByteData *)&cfd_except,(ByteData *)local_28,(SigHashType *)0x0);
  cfd::core::ByteData::~ByteData((ByteData *)&cfd_except);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  local_89 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,(AssertionResult *)0x6e96c0,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x22d,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureFromDerHexEmpty) {
  try {
    ByteData hex_sig;
    ByteData byte_data = CryptoUtil::ConvertSignatureFromDer(hex_sig, nullptr);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "der decode error.");
    return;
  }
  ASSERT_TRUE(false);
}